

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void fallbackSimpleSort(UInt32 *fmap,UInt32 *eclass,Int32 lo,Int32 hi)

{
  UInt32 UVar1;
  uint uVar2;
  bool bVar3;
  UInt32 UVar4;
  UInt32 ec_tmp;
  Int32 tmp;
  Int32 j;
  Int32 i;
  Int32 hi_local;
  Int32 lo_local;
  UInt32 *eclass_local;
  UInt32 *fmap_local;
  
  if (lo != hi) {
    if (3 < hi - lo) {
      for (tmp = hi + -4; lo <= tmp; tmp = tmp + -1) {
        UVar1 = fmap[tmp];
        uVar2 = eclass[(int)UVar1];
        UVar4 = tmp;
        while( true ) {
          ec_tmp = UVar4 + 4;
          bVar3 = false;
          if ((int)ec_tmp <= hi) {
            bVar3 = eclass[fmap[(int)ec_tmp]] < uVar2;
          }
          if (!bVar3) break;
          fmap[(int)UVar4] = fmap[(int)ec_tmp];
          UVar4 = ec_tmp;
        }
        fmap[(int)UVar4] = UVar1;
      }
    }
    for (tmp = hi + -1; lo <= tmp; tmp = tmp + -1) {
      UVar1 = fmap[tmp];
      uVar2 = eclass[(int)UVar1];
      UVar4 = tmp;
      while( true ) {
        ec_tmp = UVar4 + 1;
        bVar3 = false;
        if ((int)ec_tmp <= hi) {
          bVar3 = eclass[fmap[(int)ec_tmp]] < uVar2;
        }
        if (!bVar3) break;
        fmap[(int)UVar4] = fmap[(int)ec_tmp];
        UVar4 = ec_tmp;
      }
      fmap[(int)UVar4] = UVar1;
    }
  }
  return;
}

Assistant:

static 
__inline__
void fallbackSimpleSort ( UInt32* fmap, 
                          UInt32* eclass, 
                          Int32   lo, 
                          Int32   hi )
{
   Int32 i, j, tmp;
   UInt32 ec_tmp;

   if (lo == hi) return;

   if (hi - lo > 3) {
      for ( i = hi-4; i >= lo; i-- ) {
         tmp = fmap[i];
         ec_tmp = eclass[tmp];
         for ( j = i+4; j <= hi && ec_tmp > eclass[fmap[j]]; j += 4 )
            fmap[j-4] = fmap[j];
         fmap[j-4] = tmp;
      }
   }

   for ( i = hi-1; i >= lo; i-- ) {
      tmp = fmap[i];
      ec_tmp = eclass[tmp];
      for ( j = i+1; j <= hi && ec_tmp > eclass[fmap[j]]; j++ )
         fmap[j-1] = fmap[j];
      fmap[j-1] = tmp;
   }
}